

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_buf.c
# Opt level: O1

void yajl_buf_append(yajl_buf buf,void *data,size_t len)

{
  uchar *puVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (buf->data == (uchar *)0x0) {
    buf->len = 0x800;
    puVar1 = (uchar *)(*buf->alloc->malloc)(buf->alloc->ctx,0x800);
    buf->data = puVar1;
    *puVar1 = '\0';
  }
  sVar3 = buf->len;
  do {
    sVar2 = sVar3;
    sVar3 = sVar2 * 2;
  } while (sVar2 - buf->used <= len);
  if (sVar2 != buf->len) {
    puVar1 = (uchar *)(*buf->alloc->realloc)(buf->alloc->ctx,buf->data,sVar2);
    buf->data = puVar1;
    buf->len = sVar2;
  }
  if (len != 0) {
    memcpy(buf->data + buf->used,data,len);
    sVar3 = len + buf->used;
    buf->used = sVar3;
    buf->data[sVar3] = '\0';
  }
  return;
}

Assistant:

void yajl_buf_append(yajl_buf buf, const void * data, size_t len)
{
    yajl_buf_ensure_available(buf, len);
    if (len > 0) {
        assert(data != NULL);
        memcpy(buf->data + buf->used, data, len);
        buf->used += len;
        buf->data[buf->used] = 0;
    }
}